

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O3

void monster_add_to_group(chunk_conflict *c,monster *mon,monster_group *group)

{
  wchar_t wVar1;
  mon_group_list_entry *pmVar2;
  
  if (mon->group_info[0].index != group->index) {
    __assert_fail("mon->group_info[PRIMARY_GROUP].index == group->index",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-group.c"
                  ,0xec,
                  "void monster_add_to_group(struct chunk *, struct monster *, struct monster_group *)"
                 );
  }
  pmVar2 = group->member_list;
  while( true ) {
    if (pmVar2 == (mon_group_list_entry *)0x0) {
      pmVar2 = (mon_group_list_entry *)mem_zalloc(0x10);
      pmVar2->midx = mon->midx;
      pmVar2->next = group->member_list;
      group->member_list = pmVar2;
      return;
    }
    if (pmVar2->midx == L'\xfffffffe') break;
    pmVar2 = pmVar2->next;
  }
  wVar1 = mon->midx;
  pmVar2->midx = wVar1;
  if (group->leader != L'\xfffffffe') {
    return;
  }
  group->leader = wVar1;
  return;
}

Assistant:

void monster_add_to_group(struct chunk *c, struct monster *mon,
						  struct monster_group *group)
{
	struct mon_group_list_entry *list_entry = group->member_list;

	/* Confirm we're adding to the right group */
	assert(mon->group_info[PRIMARY_GROUP].index == group->index);

	/* Replace any fake monster indices with the real one */
	while (list_entry) {
		if (list_entry->midx == MIDX_FAKE) {
			list_entry->midx = mon->midx;
			if (group->leader == MIDX_FAKE) {
				group->leader = mon->midx;
			}
			return;
		}
		list_entry = list_entry->next;
	}

	/* Make a new list entry and add it to the start of the list */
	list_entry = mem_zalloc(sizeof(struct mon_group_list_entry));
	list_entry->midx = mon->midx;
	list_entry->next = group->member_list;
	group->member_list = list_entry;
}